

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::SectionTracking::TrackedSection::TrackedSection
          (TrackedSection *this,string *name,TrackedSection *parent)

{
  _Rb_tree_header *p_Var1;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->m_runState = NotStarted;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_children)._M_t._M_impl.super__Rb_tree_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_parent = parent;
  return;
}

Assistant:

TrackedSection( std::string const& name, TrackedSection* parent )
        :   m_name( name ), m_runState( NotStarted ), m_parent( parent )
        {}